

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

string * __thiscall
cs222::Pass2::run(string *__return_storage_ptr__,Pass2 *this,string *srcFileName)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  type pIVar4;
  size_t __val;
  undefined1 auVar5 [16];
  allocator local_b6a;
  allocator local_b69;
  string local_b68;
  allocator local_b41;
  string local_b40;
  allocator local_b19;
  string local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  undefined1 local_ab8 [8];
  string progLength;
  Flag local_a8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  Instruction local_a68;
  undefined1 local_928 [8];
  string instObjCode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  string local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  size_t local_888;
  size_t iAddress;
  string local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  undefined1 local_7e0 [8];
  Instruction i;
  unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> instruction;
  __mbstate_t local_690;
  stringstream local_688 [392];
  undefined1 local_500 [16];
  string local_4f0 [8];
  string buffer;
  stringstream lineStream;
  fpos local_348 [16];
  streamoff local_338;
  size_t startInst;
  __mbstate_t local_328;
  string local_320 [8];
  string line;
  IntermediateParser iParser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string progName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream local_228 [8];
  ifstream ifs;
  string *srcFileName_local;
  Pass2 *this_local;
  
  std::__cxx11::string::operator=((string *)&this->srcFileName,(string *)srcFileName);
  readSymbols(this);
  std::operator+(&local_248,srcFileName,".listing");
  std::ifstream::ifstream(local_228,(string *)&local_248,_S_in);
  std::__cxx11::string::~string((string *)&local_248);
  parseProgramName_abi_cxx11_((string *)local_278,this,local_228);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iParser.super_Parser.nextInstruction,"Program name is \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
  std::operator+(&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iParser.super_Parser.nextInstruction,"\'");
  logDebug(&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&iParser.super_Parser.nextInstruction);
  IntermediateParser::IntermediateParser
            ((IntermediateParser *)((long)&line.field_2 + 8),(istream *)local_228);
  std::__cxx11::string::string(local_320);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&startInst,0);
  std::istream::seekg(local_228,startInst,local_328);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_228,local_320);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_228,local_320);
  local_348 = (fpos  [16])std::istream::tellg();
  local_338 = std::fpos::operator_cast_to_long(local_348);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_228,local_320);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(buffer.field_2._M_local_buf + 8),local_320,_Var2);
  std::__cxx11::string::string(local_4f0);
  std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),local_4f0);
  std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),local_4f0);
  while( true ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_4f0);
    if (*pcVar3 != '.') break;
    auVar5 = std::istream::tellg();
    local_500 = auVar5;
    local_338 = std::fpos::operator_cast_to_long((fpos *)local_500);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_228,local_320);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_688,local_320,_Var2);
    std::__cxx11::stringstream::operator=
              ((stringstream *)(buffer.field_2._M_local_buf + 8),local_688);
    std::__cxx11::stringstream::~stringstream(local_688);
    std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),local_4f0);
    std::operator>>((istream *)(buffer.field_2._M_local_buf + 8),local_4f0);
  }
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&instruction,local_338);
  std::istream::seekg(local_228,
                      instruction._M_t.
                      super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>
                      .super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl,local_690);
  IntermediateParser::next
            ((IntermediateParser *)
             &i.warnings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    bVar1 = std::operator!=((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>
                             *)&i.warnings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
    if (!bVar1) break;
    pIVar4 = std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::
             operator*((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
                       &i.warnings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Instruction::Instruction((Instruction *)local_7e0,pIVar4);
    __val = Instruction::getAddress((Instruction *)local_7e0);
    std::__cxx11::to_string(&local_860,__val);
    std::operator+(&local_840,"Operands in instruction at ",&local_860);
    std::operator+(&local_820,&local_840,": ");
    Instruction::getOperandsToken_abi_cxx11_((string *)&iAddress,(Instruction *)local_7e0);
    std::operator+(&local_800,&local_820,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iAddress);
    logDebug(&local_800);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&iAddress);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_860);
    local_888 = Instruction::getAddress((Instruction *)local_7e0);
    Instruction::getOperation_abi_cxx11_(&local_8c8,(Instruction *)local_7e0);
    std::operator+(&local_8a8,"Operation: ",&local_8c8);
    logDebug(&local_8a8);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8c8);
    Instruction::getOperandsToken_abi_cxx11_
              ((string *)((long)&instObjCode.field_2 + 8),(Instruction *)local_7e0);
    std::operator+(&local_8e8,"Operands: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&instObjCode.field_2 + 8));
    logDebug(&local_8e8);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::__cxx11::string::~string((string *)(instObjCode.field_2._M_local_buf + 8));
    Instruction::Instruction(&local_a68,(Instruction *)local_7e0);
    translate_abi_cxx11_((string *)local_928,this,&local_a68);
    Instruction::~Instruction(&local_a68);
    std::operator+(&local_a88,"Object Code: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928);
    logDebug(&local_a88);
    std::__cxx11::string::~string((string *)&local_a88);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->objectCode,(value_type *)local_928);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->correspondingAddresses,&local_888);
    local_a8c = FLAG_EXTENDED;
    bVar1 = Instruction::isSet((Instruction *)local_7e0,&stack0xfffffffffffff574);
    if (bVar1) {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->modificationAddresses,&local_888);
    }
    IntermediateParser::next((IntermediateParser *)((long)&progLength.field_2 + 8));
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::operator=
              ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
               &i.warnings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
               ((long)&progLength.field_2 + 8));
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
              ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
               ((long)&progLength.field_2 + 8));
    std::__cxx11::string::~string((string *)local_928);
    Instruction::~Instruction((Instruction *)local_7e0);
  }
  parseProgramLength_abi_cxx11_((string *)local_ab8,this,local_228);
  std::operator+(&local_af8,"Program is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ab8);
  std::operator+(&local_ad8,&local_af8," bytes long");
  logDebug(&local_ad8);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  bVar1 = std::operator==(&this->errorReportMessage,"");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b18,"Dumping Modification Addresses",&local_b19);
    logDebug(&local_b18);
    std::__cxx11::string::~string((string *)&local_b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
    dumpDeque(&this->modificationAddresses);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b40,"Dumping Object Codes",&local_b41);
    logDebug(&local_b40);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator((allocator<char> *)&local_b41);
    dumpDeque(&this->objectCode);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b68,"Dumping Corresponding Addressses",&local_b69)
    ;
    logDebug(&local_b68);
    std::__cxx11::string::~string((string *)&local_b68);
    std::allocator<char>::~allocator((allocator<char> *)&local_b69);
    dumpDeque(&this->correspondingAddresses);
    writeObjectProgram(this,(string *)local_278,(string *)local_ab8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Pass 2 finished successfully",&local_b6a);
    std::allocator<char>::~allocator((allocator<char> *)&local_b6a);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->errorReportMessage);
  }
  std::__cxx11::string::~string((string *)local_ab8);
  std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
            ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
             &i.warnings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_4f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(buffer.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_320);
  IntermediateParser::~IntermediateParser((IntermediateParser *)((long)&line.field_2 + 8));
  std::__cxx11::string::~string((string *)local_278);
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::run(std::string srcFileName) {
        Pass2::srcFileName = srcFileName;

        readSymbols();

        std::ifstream ifs(srcFileName + ".listing");

        std::string progName = parseProgramName(ifs);
        logDebug("Program name is '" + progName + "'");

        cs222::IntermediateParser iParser(ifs);

        std::string line;
        ifs.seekg(0);
        getline(ifs, line); // Skip first line (column names).
        getline(ifs, line); // Skip the second line (empty line).
        size_t startInst = ifs.tellg();
        getline(ifs, line);

        // Skip comment lines
        std::stringstream lineStream(line);
        std::string buffer;
        lineStream >> buffer; // Skip line number.
        lineStream >> buffer; // Skip address.
        while (buffer[0] == '.')
        {
            startInst = ifs.tellg();
            getline(ifs, line);
            lineStream = std::stringstream(line);
            lineStream >> buffer; // Skip line number.
            lineStream >> buffer; // Skip address.
        }
        ifs.seekg(startInst);

        std::unique_ptr<cs222::Instruction> instruction = iParser.next();
        while (instruction != nullptr) {
            Instruction i = *instruction;
            logDebug("Operands in instruction at " +
                    std::to_string(i.getAddress()) + ": " +
                    i.getOperandsToken());
            const size_t iAddress = i.getAddress();
            logDebug("Operation: " + i.getOperation());
            logDebug("Operands: " + i.getOperandsToken());
            std::string instObjCode = translate(i);
            logDebug("Object Code: " + instObjCode);
            objectCode.push_back(instObjCode);
            correspondingAddresses.push_back(iAddress);
            if (i.isSet(i.FLAG_EXTENDED)) {
                modificationAddresses.push_back(iAddress);
            }
            instruction = iParser.next();
        }

        std::string progLength = parseProgramLength(ifs);
        logDebug("Program is " + progLength + " bytes long");

        if (errorReportMessage == "") {
            logDebug("Dumping Modification Addresses");
            dumpDeque(modificationAddresses);
            logDebug("Dumping Object Codes");
            dumpDeque(objectCode);
            logDebug("Dumping Corresponding Addressses");
            dumpDeque(correspondingAddresses);
            writeObjectProgram(progName, progLength);
            return "Pass 2 finished successfully";
        } else {
            return errorReportMessage;
        }
    }